

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::IsUpperTriangular(Matrix *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  bool local_5d;
  int local_5c;
  long local_58;
  long local_50;
  long local_48;
  Fraction local_38;
  
  local_5d = this->m_ < 1;
  if (0 < this->m_) {
    local_48 = 1;
    local_50 = 0x30;
    local_5c = 1;
    local_58 = 0;
    do {
      lVar1 = local_58 + 1;
      bVar3 = lVar1 < this->n_;
      if (lVar1 < this->n_) {
        lVar6 = *(long *)&(this->elements_).
                          super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_48].
                          super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                          super__Vector_impl_data;
        Fraction::Fraction(&local_38,0);
        bVar4 = operator!=((Fraction *)(lVar6 + local_58 * 8),&local_38);
        iVar5 = local_5c;
        lVar6 = local_50;
        while (!bVar4) {
          iVar5 = iVar5 + 1;
          bVar3 = iVar5 < this->n_;
          if (this->n_ <= iVar5) goto LAB_0010bb5b;
          lVar2 = *(long *)((long)&(((this->elements_).
                                     super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                                   super__Vector_impl_data + lVar6);
          lVar6 = lVar6 + 0x18;
          Fraction::Fraction(&local_38,0);
          bVar4 = operator!=((Fraction *)(lVar2 + local_58 * 8),&local_38);
        }
        if (bVar3) {
          return local_5d;
        }
      }
LAB_0010bb5b:
      local_48 = local_48 + 1;
      local_50 = local_50 + 0x18;
      local_5c = local_5c + 1;
      local_5d = this->m_ <= lVar1;
      local_58 = lVar1;
    } while (lVar1 < this->m_);
  }
  return local_5d;
}

Assistant:

bool Matrix::IsUpperTriangular() const {
  for (int column = 0; column < m_; ++column) {
    for (int row = column + 1; row < n_; ++row) {
      if (elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}